

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetTranslucent
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  DObject *this;
  char *pcVar6;
  double dVar7;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e3978;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e3968:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3978:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcb1,
                  "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_003e38c9;
    bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e3978;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_003e3968;
LAB_003e38c9:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      dVar2 = param[1].field_0.f;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e390b;
        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e390b:
          iVar3 = param[2].field_0.i;
          pbVar1 = (byte *)((long)&this[6].GCNext + 3);
          *pbVar1 = *pbVar1 & 0xfd;
          dVar7 = 1.0;
          if (dVar2 <= 1.0) {
            dVar7 = dVar2;
          }
          this[7]._vptr_DObject = (_func_int **)(-(ulong)(0.0 < dVar2) & (ulong)dVar7);
          lVar4 = 6;
          if (iVar3 != 0) {
            lVar4 = (ulong)(iVar3 != 2) * 5 + 2;
          }
          *(FRenderStyle *)&this[6].GCNext = LegacyRenderStyles[lVar4];
          return 0;
        }
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcb3,
                    "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcb2,
                "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTranslucent)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT		(alpha);
	PARAM_INT_DEF	(mode);

	mode = mode == 0 ? STYLE_Translucent : mode == 2 ? STYLE_Fuzzy : STYLE_Add;

	self->RenderStyle.Flags &= ~STYLEF_Alpha1;
	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}